

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ModalFilter.cpp
# Opt level: O1

int ModalFilter::CreateCallback(UnityAudioEffectState *state)

{
  float *params;
  void *pvVar1;
  
  params = (float *)operator_new(0xa0d0);
  memset(params,0,0xa0d0);
  (state->field_0).field_0.effectdata = params;
  params[0x282c] = 5.73972e-42;
  pvVar1 = operator_new__(0xc00);
  *(void **)(params + 0x282e) = pvVar1;
  pvVar1 = operator_new__(0xc00);
  *(void **)(params + 0x2830) = pvVar1;
  InitParametersFromDefinitions(InternalRegisterEffectDefinition,params);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK CreateCallback(UnityAudioEffectState* state)
    {
        EffectData* effectdata = new EffectData;
        memset(effectdata, 0, sizeof(EffectData));
        state->effectdata = effectdata;
        effectdata->data.analyzer.spectrumSize = 4096;
        effectdata->data.display1 = new float[MAXRESONATORS * 3];
        effectdata->data.display2 = new float[MAXRESONATORS * 3];
        InitParametersFromDefinitions(InternalRegisterEffectDefinition, effectdata->data.p);
        return UNITY_AUDIODSP_OK;
    }